

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O2

void __thiscall PatchSecretARG::inject_code(PatchSecretARG *this,ROM *rom,World *world)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Map *pMVar3;
  World *this_00;
  uint32_t uVar4;
  uint32_t value;
  Code *pCVar5;
  Item *pIVar6;
  initializer_list<unsigned_char> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<md::DataRegister> __l_04;
  initializer_list<md::AddressRegister> __l_05;
  initializer_list<md::DataRegister> __l_06;
  initializer_list<md::AddressRegister> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<md::DataRegister> __l_09;
  initializer_list<md::AddressRegister> __l_10;
  allocator_type local_26a;
  allocator_type local_269;
  Code func_pre_use;
  Code func;
  Code func_post_use;
  _Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> local_d8;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_c0;
  World *local_a8;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_a0;
  undefined1 local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined **local_40;
  undefined1 local_38;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1204;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpiw(&func,0x290,(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"no",(allocator<char> *)&func_post_use);
  local_a8 = world;
  md::Code::bne(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff102c;
  md::Code::btst(&func,'\0',(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"no",(allocator<char> *)&func_post_use);
  md::Code::bne(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff114e;
  md::Code::cmpil(&func,0x2000710,(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"no",(allocator<char> *)&func_post_use);
  md::Code::bne(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff102c;
  md::Code::bset(&func,'\0',(Param *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5800;
  md::Code::movew(&func,0xffff,(Param *)&func_pre_use);
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(func_post_use._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0x7400);
  __l._M_len = 2;
  __l._M_array = (iterator)&func_post_use;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&func_pre_use._bytes,__l,(allocator_type *)&local_a0);
  md::Code::trap(&func,'\0',&func_pre_use._bytes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"no",(allocator<char> *)&func_post_use);
  md::Code::label(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff114f;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_post_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::moveb(&func,(Param *)&func_pre_use,(Param *)&func_post_use);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"",(allocator<char> *)&func_post_use);
  uVar4 = md::ROM::inject_code(rom,&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  p_Var1 = &func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._labels._M_t._M_impl._0_8_ = 0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func_pre_use._pending_branches._M_t._M_impl._0_8_ = 0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &func_pre_use._labels._M_t._M_impl.super__Rb_tree_header;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  pCVar5 = md::Code::jsr(&func_pre_use,uVar4);
  md::ROM::set_code(rom,0x76ee,pCVar5);
  md::Code::~Code(&func_pre_use);
  md::Code::~Code(&func);
  pMVar3 = this->_room_3;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff102c;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::btst(&func,'\x01',(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"ret",(allocator<char> *)&func_post_use);
  md::Code::beq(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff102c;
  md::Code::btst(&func,'\x02',(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"ret",(allocator<char> *)&func_post_use);
  md::Code::beq(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff102c;
  md::Code::btst(&func,'\x03',(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"ret",(allocator<char> *)&func_post_use);
  md::Code::beq(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff102c;
  md::Code::btst(&func,'\x04',(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"ret",(allocator<char> *)&func_post_use);
  md::Code::beq(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5780;
  md::Code::movew(&func,0xffff,(Param *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"ret",(allocator<char> *)&func_post_use);
  md::Code::label(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"",(allocator<char> *)&func_post_use);
  uVar4 = md::ROM::inject_code(rom,&func,(string *)&func_pre_use);
  pMVar3->_map_setup_addr = uVar4;
  std::__cxx11::string::~string((string *)&func_pre_use);
  md::Code::~Code(&func);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1204;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  func_pre_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  md::Code::cmpiw(&func_pre_use,0x326,(Param *)&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"regular_test",(allocator<char> *)&func_post_use);
  this_00 = local_a8;
  md::Code::bne(&func_pre_use,(string *)&func);
  std::__cxx11::string::~string((string *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5400;
  md::Code::cmpiw(&func_pre_use,0x2514,(Param *)&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"regular_test",(allocator<char> *)&func_post_use);
  md::Code::bne(&func_pre_use,(string *)&func);
  std::__cxx11::string::~string((string *)&func);
  md::Code::jmp(&func_pre_use,0x8bb2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"regular_test",(allocator<char> *)&func_post_use);
  md::Code::label(&func_pre_use,(string *)&func);
  std::__cxx11::string::~string((string *)&func);
  pIVar6 = World::item(this_00,'+');
  md::Code::jmp(&func_pre_use,pIVar6->_pre_use_address);
  pIVar6 = World::item(this_00,'+');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"",(allocator<char> *)&func_post_use);
  uVar4 = md::ROM::inject_code(rom,&func_pre_use,(string *)&func);
  (*pIVar6->_vptr_Item[2])(pIVar6,(ulong)uVar4);
  std::__cxx11::string::~string((string *)&func);
  func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1204;
  func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func_post_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func_post_use._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpiw(&func_post_use,0x326,(Param *)&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"tp_to_golas_heart",(allocator<char> *)&local_a0);
  md::Code::beq(&func_post_use,(string *)&func);
  std::__cxx11::string::~string((string *)&func);
  pIVar6 = World::item(this_00,'+');
  md::Code::jmp(&func_post_use,pIVar6->_post_use_address);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"tp_to_golas_heart",(allocator<char> *)&local_a0);
  md::Code::label(&func_post_use,(string *)&func);
  std::__cxx11::string::~string((string *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl._0_1_ = 1;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT71(func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_,
                2);
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       CONCAT71(func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_,3
               );
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)&PTR_getXn_00246bf0;
  func._labels._M_t._M_impl._0_1_ = 4;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&PTR_getXn_00246bf0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT71(func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_,5);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &PTR_getXn_00246bf0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       CONCAT71(func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_,6);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&PTR_getXn_00246bf0
  ;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&PTR_getXn_00246bf0;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&func;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_d8,__l_00,
             &local_26a);
  local_a0._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  local_88 = 1;
  local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_getXn_00246c60;
  local_78 = 2;
  local_80 = &PTR_getXn_00246c60;
  local_68 = 3;
  local_70 = &PTR_getXn_00246c60;
  local_58 = 4;
  local_60 = &PTR_getXn_00246c60;
  local_48 = 5;
  local_50 = &PTR_getXn_00246c60;
  local_38 = 6;
  local_40 = &PTR_getXn_00246c60;
  __l_01._M_len = 7;
  __l_01._M_array = (iterator)&local_a0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_c0,__l_01,
             &local_269);
  md::Code::movem_to_stack
            (&func_post_use,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_d8
             ,(vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_c0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_c0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_d8);
  local_a0._M_impl.super__Vector_impl_data._M_start._0_2_ = 0x700;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&func._bytes,__l_02,(allocator_type *)&local_d8);
  md::Code::trap(&func_post_use,'\0',&func._bytes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&func);
  md::Code::jsr(&func_post_use,0x29046);
  md::Code::add_word(&func_post_use,0);
  md::Code::jsr(&func_post_use,0x852);
  md::Code::jsr(&func_post_use,0x1592);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1052;
  md::Code::andib(&func_post_use,0xf0,(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1052;
  md::Code::addib(&func_post_use,'\x01',(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1051;
  md::Code::andib(&func_post_use,'\x0f',(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1051;
  md::Code::addib(&func_post_use,'\x10',(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5400;
  md::Code::movew(&func_post_use,0x2f11,(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5402;
  md::Code::movew(&func_post_use,0x708,(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5404;
  md::Code::moveb(&func_post_use,0x88,(Param *)&func);
  local_a0._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_a0._M_impl.super__Vector_impl_data._M_start._2_6_,0x4d00);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&func._bytes,__l_03,(allocator_type *)&local_d8);
  md::Code::trap(&func_post_use,'\0',&func._bytes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&func);
  md::Code::jsr(&func_post_use,0x44c);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func_post_use,0x39,(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5412;
  md::Code::movew(&func_post_use,0,(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5422;
  md::Code::moveb(&func_post_use,'\0',(Param *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5439;
  md::Code::moveb(&func_post_use,'\0',(Param *)&func);
  md::Code::jsr(&func_post_use,0x1586e);
  md::Code::jsr(&func_post_use,0x434);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::clrb(&func_post_use,(Param *)&func);
  md::Code::jsr(&func_post_use,0x2824);
  md::Code::jsr(&func_post_use,0x410);
  md::Code::jsr(&func_post_use,0x8eb4);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl._0_1_ = 1;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT71(func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_,
                2);
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       CONCAT71(func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_,3
               );
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)&PTR_getXn_00246bf0;
  func._labels._M_t._M_impl._0_1_ = 4;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&PTR_getXn_00246bf0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT71(func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_,5);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &PTR_getXn_00246bf0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       CONCAT71(func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right._1_7_,6);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&PTR_getXn_00246bf0
  ;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&PTR_getXn_00246bf0;
  __l_04._M_len = 8;
  __l_04._M_array = (iterator)&func;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_d8,__l_04,
             &local_26a);
  local_a0._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a0._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  local_88 = 1;
  local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_getXn_00246c60;
  local_78 = 2;
  local_80 = &PTR_getXn_00246c60;
  local_68 = 3;
  local_70 = &PTR_getXn_00246c60;
  local_58 = 4;
  local_60 = &PTR_getXn_00246c60;
  local_48 = 5;
  local_50 = &PTR_getXn_00246c60;
  local_38 = 6;
  local_40 = &PTR_getXn_00246c60;
  __l_05._M_len = 7;
  __l_05._M_array = (iterator)&local_a0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_c0,__l_05,
             &local_269);
  md::Code::movem_from_stack
            (&func_post_use,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_d8
             ,(vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_c0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_c0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_d8);
  md::Code::rts(&func_post_use);
  pIVar6 = World::item(local_a8,'+');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"",(allocator<char> *)&local_a0);
  uVar4 = md::ROM::inject_code(rom,&func_post_use,(string *)&func);
  (*pIVar6->_vptr_Item[3])(pIVar6,(ulong)uVar4);
  std::__cxx11::string::~string((string *)&func);
  md::Code::~Code(&func_post_use);
  md::Code::~Code(&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"",(allocator<char> *)&func_pre_use);
  uVar4 = md::ROM::inject_bytes
                    (rom,&gnome_text_map_ids_table.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     (string *)&func);
  std::__cxx11::string::~string((string *)&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func,"",(allocator<char> *)&func_pre_use);
  value = md::ROM::inject_bytes
                    (rom,&gnome_command_words_table.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     (string *)&func);
  std::__cxx11::string::~string((string *)&func);
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  func_pre_use._pending_branches._M_t._M_impl._0_1_ = 1;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_getXn_00246bf0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT71(func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent._1_7_,2);
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &PTR_getXn_00246bf0;
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&func_pre_use;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&func_post_use,__l_06,
             (allocator_type *)&local_c0);
  local_d8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_a0,__l_07,
             (allocator_type *)&local_26a);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&func_post_use,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_a0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_a0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&func_post_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246ce8;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1206;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(func_post_use._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish._1_7_,2);
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,(Param *)&func_pre_use,(Param *)&func_post_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,1,(Param *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  md::Code::lea(&func,uVar4,(AddressRegister *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"loop_start",(allocator<char> *)&func_post_use);
  md::Code::label(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246d28;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&PTR_getXn_00246c60;
  func_pre_use._pending_branches._M_t._M_impl._0_3_ = 0x20000;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(func_post_use._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish._1_7_,1);
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,(Param *)&func_pre_use,(Param *)&func_post_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"return",(allocator<char> *)&func_post_use);
  md::Code::bmi(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(func_pre_use._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish._1_7_,1);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(func_post_use._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish._1_7_,2);
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::cmpw(&func,(Param *)&func_pre_use,(DataRegister *)&func_post_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"map_not_found",(allocator<char> *)&func_post_use);
  md::Code::bne(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  md::Code::lea(&func,value,(AddressRegister *)&func_pre_use);
  md::Code::jsr(&func,0x253f8);
  func_post_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(func_post_use._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0x7400);
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&func_post_use;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&func_pre_use._bytes,__l_08,(allocator_type *)&local_a0);
  md::Code::trap(&func,'\0',&func_pre_use._bytes);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"return",(allocator<char> *)&func_post_use);
  md::Code::bra(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"map_not_found",(allocator<char> *)&func_post_use);
  md::Code::label(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  md::Code::adda(&func,2,(AddressRegister *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::addqw(&func,'\x04',(Register *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"loop_start",(allocator<char> *)&func_post_use);
  md::Code::bra(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"return",(allocator<char> *)&func_post_use);
  md::Code::label(&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)func_pre_use._bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  func_pre_use._pending_branches._M_t._M_impl._0_1_ = 1;
  func_pre_use._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_getXn_00246bf0;
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT71(func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent._1_7_,2);
  func_pre_use._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       &PTR_getXn_00246bf0;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&func_pre_use;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&func_post_use,__l_09,
             (allocator_type *)&local_c0);
  local_d8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&local_d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_a0,__l_10,
             (allocator_type *)&local_26a);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&func_post_use,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_a0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_a0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base
            ((_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> *)&func_post_use);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&func_pre_use,"",(allocator<char> *)&func_post_use);
  uVar4 = md::ROM::inject_code(rom,&func,(string *)&func_pre_use);
  std::__cxx11::string::~string((string *)&func_pre_use);
  md::Code::~Code(&func);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl._0_8_ = 0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._pending_branches._M_t._M_impl._0_8_ = 0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar5 = md::Code::jmp(&func,uVar4);
  md::ROM::set_code(rom,0x267d8,pCVar5);
  md::Code::~Code(&func);
  return;
}

Assistant:

static void add_foxy_in_knt(RandomizerWorld& world)
{
    Map* map = world.map(MAP_PILLAR_HALLWAY_TO_NOLE);
    Entity* foxy = new Entity({
        .type_id = ENTITY_NPC_MAGIC_FOX,
        .position = Position(0x10, 0x2A, 0),
        .orientation = ENTITY_ORIENTATION_SW
    });
    map->add_entity(foxy);
    world.add_custom_dialogue_raw(foxy, "Foxy: What you are about to\naccomplish is grand, but can\nyou feel there is more to it?\x1e\n"
                                    "This island hides a bigger\nmystery, something that has\nyet to be solved...\x1e\n"
                                    "Perhaps you should take a\ncloser look at the\ncrypt of Mercator.\x03");
}